

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O1

void KBuffer_vprintf(KonohaContext *kctx,KBuffer *wb,char *fmt,__va_list_tag *ap)

{
  KGrowingArray *m;
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  va_list ap2;
  __va_list_tag local_38;
  
  local_38.reg_save_area = ap->reg_save_area;
  local_38.gp_offset = ap->gp_offset;
  local_38.fp_offset = ap->fp_offset;
  local_38.overflow_arg_area = ap->overflow_arg_area;
  m = wb->m;
  sVar1 = m->bytesize;
  iVar2 = (*kctx->platApi->vsnprintf_i)((m->field_1).bytebuf + sVar1,m->bytemax - sVar1,fmt,ap);
  uVar3 = (ulong)iVar2;
  if (m->bytemax - sVar1 <= uVar3) {
    KArray_Expand(kctx,m,uVar3 + 1);
    iVar2 = (*kctx->platApi->vsnprintf_i)
                      ((m->field_1).bytebuf + sVar1,m->bytemax - sVar1,fmt,&local_38);
    uVar3 = (ulong)iVar2;
  }
  m->bytesize = m->bytesize + uVar3;
  return;
}

Assistant:

static void KBuffer_vprintf(KonohaContext *kctx, KBuffer *wb, const char *fmt, va_list ap)
{
	va_list ap2;
#ifdef _MSC_VER
	ap2 = ap;
#else
	va_copy(ap2, ap);
#endif
	KGrowingArray *m = wb->m;
	size_t s = m->bytesize;
	size_t n = PLATAPI vsnprintf_i( m->bytebuf + s, m->bytemax - s, fmt, ap);
	if(n >= (m->bytemax - s)) {
		KArray_Expand(kctx, m, n + 1);
		n = PLATAPI vsnprintf_i(m->bytebuf + s, m->bytemax - s, fmt, ap2);
	}
	va_end(ap2);
	m->bytesize += n;
}